

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcNamedUnit).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcNamedUnit).field_0x38 = vtt[8];
  std::__cxx11::string::~string((string *)&this->Name);
  std::__cxx11::string::~string((string *)&(this->super_IfcNamedUnit).field_0x48);
  IfcNamedUnit::~IfcNamedUnit(&this->super_IfcNamedUnit,vtt + 1);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}